

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PerformImplementation.hpp
# Opt level: O1

void InstructionSet::M68k::Primitive::
     rox<(InstructionSet::M68k::Operation)95,unsigned_int,CPU::MC68000::ProcessorBase>
               (uint32_t source,uint *destination,Status *status,ProcessorBase *flow_controller)

{
  ulong uVar1;
  long lVar2;
  byte bVar3;
  uint uVar4;
  int iVar5;
  
  uVar4 = source & 0x3f;
  flow_controller->dynamic_instruction_length_ = uVar4 + 2;
  iVar5 = uVar4 - (uVar4 / 0x21 << 5 | uVar4 / 0x21);
  if (iVar5 == 0) {
    uVar1 = status->extend_flag;
    lVar2 = 0x18;
  }
  else {
    uVar4 = *destination;
    bVar3 = (byte)iVar5;
    uVar1 = (ulong)((uVar4 >> ((byte)(0x20 - bVar3) & 0x1f) & 1) != 0);
    status->carry_flag = uVar1;
    if (iVar5 == 1) {
      uVar4 = (uint)(status->extend_flag != 0) + uVar4 * 2;
    }
    else if (iVar5 == 0x20) {
      uVar4 = (uint)(status->extend_flag != 0) << 0x1f | uVar4 >> 1;
    }
    else {
      uVar4 = uVar4 >> (0x21 - bVar3 & 0x1f) | uVar4 << (bVar3 & 0x1f) |
              (uint)(status->extend_flag != 0) << (bVar3 - 1 & 0x1f);
    }
    *destination = uVar4;
    lVar2 = 0x20;
  }
  *(ulong *)((long)&status->trace_flag + lVar2) = uVar1;
  uVar4 = *destination;
  status->zero_result = (ulong)uVar4;
  status->negative_flag = (ulong)(uVar4 & 0x80000000);
  status->overflow_flag = 0;
  return;
}

Assistant:

int shift_count(uint8_t source, FlowController &flow_controller) {
	const int count = source & 63;
	flow_controller.template did_shift<IntT>(count);
	return count;
}